

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagSlow(CodedInputStream *this)

{
  bool bVar1;
  long *in_RDI;
  uint64 *unaff_retaddr;
  uint64 result;
  int current_position;
  CodedInputStream *in_stack_000000a8;
  
  if ((*in_RDI != in_RDI[1]) || (bVar1 = Refresh(in_stack_000000a8), bVar1)) {
    ReadVarint64((CodedInputStream *)result,unaff_retaddr);
  }
  else if ((int)in_RDI[3] - *(int *)((long)in_RDI + 0x2c) < (int)in_RDI[6]) {
    *(undefined1 *)((long)in_RDI + 0x24) = 1;
  }
  else {
    *(bool *)((long)in_RDI + 0x24) = (int)in_RDI[5] == (int)in_RDI[6];
  }
  return 0;
}

Assistant:

uint32 CodedInputStream::ReadTagSlow() {
  if (buffer_ == buffer_end_) {
    // Call refresh.
    if (!Refresh()) {
      // Refresh failed.  Make sure that it failed due to EOF, not because
      // we hit total_bytes_limit_, which, unlike normal limits, is not a
      // valid place to end a message.
      int current_position = total_bytes_read_ - buffer_size_after_limit_;
      if (current_position >= total_bytes_limit_) {
        // Hit total_bytes_limit_.  But if we also hit the normal limit,
        // we're still OK.
        legitimate_message_end_ = current_limit_ == total_bytes_limit_;
      } else {
        legitimate_message_end_ = true;
      }
      return 0;
    }
  }

  // For the slow path, just do a 64-bit read. Try to optimize for one-byte tags
  // again, since we have now refreshed the buffer.
  uint64 result = 0;
  if (!ReadVarint64(&result)) return 0;
  return static_cast<uint32>(result);
}